

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replicode_common.h
# Opt level: O1

P<r_exec::Overlay> * __thiscall
core::P<r_exec::Overlay>::operator=(P<r_exec::Overlay> *this,P<r_exec::Overlay> *p)

{
  _Object *p_Var1;
  _Object *p_Var2;
  
  p_Var1 = p->object;
  p_Var2 = this->object;
  if (p_Var2 != p_Var1) {
    if (p_Var2 != (_Object *)0x0) {
      LOCK();
      (p_Var2->refCount).super___atomic_base<long>._M_i =
           (p_Var2->refCount).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      if ((p_Var2->refCount).super___atomic_base<long>._M_i < 1) {
        (*p_Var2->_vptr__Object[1])();
      }
    }
    this->object = p_Var1;
    if (p_Var1 != (_Object *)0x0) {
      LOCK();
      (p_Var1->refCount).super___atomic_base<long>._M_i =
           (p_Var1->refCount).super___atomic_base<long>._M_i + 1;
      UNLOCK();
    }
  }
  return this;
}

Assistant:

P<C> &operator =(const P<C> &p)
    {
        return this->operator =((C *)p.object);
    }